

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiRenderer.cpp
# Opt level: O3

void __thiscall
myvk::ImGuiRenderer::create_pipeline
          (ImGuiRenderer *this,Ptr<RenderPass> *render_pass,uint32_t subpass)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ShaderModule *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  void *this_01;
  int iVar4;
  undefined4 extraout_var;
  initializer_list<std::shared_ptr<myvk::DescriptorSetLayout>_> __l;
  initializer_list<VkPushConstantRange> __l_00;
  VkPipelineColorBlendStateCreateInfo color_blending;
  VkPipelineViewportStateCreateInfo viewport_state;
  VkDynamicState dynamic_states [2];
  VkPipelineShaderStageCreateInfo shader_stages [2];
  undefined1 local_308 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2e0;
  element_type *local_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2d0;
  VkPipelineColorBlendAttachmentState *local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  VkPipelineVertexInputStateCreateInfo local_2a8;
  undefined1 local_278 [64];
  VkPipelineLayout local_238;
  void *pvStack_230;
  undefined8 local_228;
  VkViewport *pVStack_220;
  undefined8 local_218;
  VkRect2D *pVStack_210;
  VkDynamicState local_200 [2];
  VkVertexInputAttributeDescription local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [48];
  VkPipelineShaderStageCreateInfo local_198;
  VkVertexInputBindingDescription local_164;
  VkGraphicsPipelineCreateInfo local_158;
  VkPipelineColorBlendAttachmentState local_c8;
  VkPipelineDynamicStateCreateInfo local_a8;
  VkPipelineInputAssemblyStateCreateInfo local_88;
  VkPipelineMultisampleStateCreateInfo local_68;
  Ptr<Device> *device;
  
  iVar4 = (*(((render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  device = (Ptr<Device> *)CONCAT44(extraout_var,iVar4);
  local_308._32_8_ =
       (this->m_descriptor_set_layout).
       super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Stack_2e0 = (this->m_descriptor_set_layout).
                super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (p_Stack_2e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_2e0->_M_use_count = p_Stack_2e0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_2e0->_M_use_count = p_Stack_2e0->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)(local_308 + 0x20);
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
            *)&local_158,__l,(allocator_type *)&local_2a8);
  local_1f8.location = 1;
  local_1f8.binding = 0;
  local_1f8.format = VK_FORMAT_R8G8_UNORM;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_1f8;
  std::vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::vector
            ((vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)local_1c8,__l_00,
             (allocator_type *)&local_238);
  PipelineLayout::Create
            ((PipelineLayout *)local_278,device,
             (vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
              *)&local_158,
             (vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)local_1c8);
  uVar3 = local_278._8_8_;
  uVar2 = local_278._0_8_;
  local_278._0_8_ = (_func_int **)0x0;
  local_278._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_pipeline_layout).
           super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_pipeline_layout).super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar2;
  (this->m_pipeline_layout).super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
    }
  }
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
  }
  local_308._24_8_ = render_pass;
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
             *)&local_158);
  if (p_Stack_2e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2e0);
  }
  ShaderModule::Create((ShaderModule *)&local_158,device,(uint32_t *)&kShaderVertSpv,0x510);
  this_01 = local_158.pNext;
  this_00 = (ShaderModule *)CONCAT44(local_158._4_4_,local_158.sType);
  ShaderModule::Create((ShaderModule *)&local_158,device,(uint32_t *)&kShaderFragSpv,0x304);
  ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)local_1c8,this_00,VK_SHADER_STAGE_VERTEX_BIT,
             (VkSpecializationInfo *)0x0);
  ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)(local_1c8 + 0x30),
             (ShaderModule *)CONCAT44(local_158._4_4_,local_158.sType),VK_SHADER_STAGE_FRAGMENT_BIT,
             (VkSpecializationInfo *)0x0);
  local_308._16_8_ = &this->m_pipeline_layout;
  local_2a8.pVertexBindingDescriptions = &local_164;
  local_164.binding = 0;
  local_164.stride = 0x14;
  local_164.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  local_1f8.location = 0;
  local_1f8.binding = 0;
  local_1f8.format = VK_FORMAT_R32G32_SFLOAT;
  local_1f8.offset = 0;
  local_1e8 = 1;
  uStack_1e0 = 0x800000067;
  local_1d8 = 2;
  uStack_1d0 = 0x1000000025;
  local_2a8.pNext = (void *)0x0;
  local_2a8.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_2a8._4_4_ = 0;
  local_2a8.flags = 0;
  local_2a8.vertexBindingDescriptionCount = 1;
  local_2a8.vertexAttributeDescriptionCount = 3;
  local_2a8._36_4_ = 0;
  local_88.pNext = (void *)0x0;
  local_88.primitiveRestartEnable = 0;
  local_88._28_4_ = 0;
  local_88.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_88._4_4_ = 0;
  local_88.flags = 0;
  local_88.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  local_a8.pDynamicStates = local_200;
  local_200[0] = VK_DYNAMIC_STATE_VIEWPORT;
  local_200[1] = VK_DYNAMIC_STATE_SCISSOR;
  local_a8.pNext = (void *)0x0;
  local_a8.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_a8._4_4_ = 0;
  local_a8.flags = 0;
  local_a8.dynamicStateCount = 2;
  pvStack_230 = (void *)0x0;
  pVStack_220 = (VkViewport *)0x0;
  pVStack_210 = (VkRect2D *)0x0;
  local_238 = (VkPipelineLayout)0x16;
  local_228._0_4_ = 0;
  local_228._4_4_ = 1;
  local_218._0_4_ = 1;
  local_218._4_4_ = 0;
  local_278._8_8_ = (element_type *)0x0;
  local_278._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278._48_8_ = (pointer)0x0;
  local_278._40_8_ = (pointer)0x0;
  local_278._0_8_ = (_func_int **)0x17;
  local_278._24_8_ = (element_type *)0x0;
  local_278._56_8_ = (pointer)0x3f800000;
  local_278._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.pNext = (void *)0x0;
  local_68.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_68._4_4_ = 0;
  local_68.sampleShadingEnable = 0;
  local_68.minSampleShading = 1.0;
  local_68.flags = 0;
  local_68.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_68.pSampleMask = (VkSampleMask *)0x0;
  local_68.alphaToCoverageEnable = 0;
  local_68.alphaToOneEnable = 0;
  local_2c8 = &local_c8;
  local_c8.blendEnable = 1;
  local_c8.srcColorBlendFactor = VK_BLEND_FACTOR_SRC_ALPHA;
  local_c8.dstColorBlendFactor = VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA;
  local_c8.colorBlendOp = VK_BLEND_OP_ADD;
  local_c8.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  local_c8.dstAlphaBlendFactor = VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA;
  local_c8.alphaBlendOp = VK_BLEND_OP_ADD;
  local_c8.colorWriteMask = 0xf;
  p_Stack_2e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2d8 = (element_type *)0x0;
  uStack_2c0 = 0;
  local_2b8 = 0;
  local_308._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1a;
  _Stack_2d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000000;
  local_2a8.pVertexAttributeDescriptions = &local_1f8;
  memset(&local_158,0,0x90);
  local_158.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_158.stageCount = 2;
  local_158.pStages = (VkPipelineShaderStageCreateInfo *)local_1c8;
  local_158.pVertexInputState = &local_2a8;
  local_158.pViewportState = (VkPipelineViewportStateCreateInfo *)&local_238;
  local_158.pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)local_278;
  local_158.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)(local_308 + 0x20);
  local_158.pInputAssemblyState = &local_88;
  local_158.pMultisampleState = &local_68;
  local_158.pDynamicState = &local_a8;
  local_158.subpass = subpass;
  GraphicsPipeline::Create
            ((GraphicsPipeline *)local_308,(Ptr<PipelineLayout> *)local_308._16_8_,
             (Ptr<RenderPass> *)local_308._24_8_,&local_158);
  uVar3 = local_308._8_8_;
  uVar2 = local_308._0_8_;
  local_308._0_8_ = (_func_int **)0x0;
  local_308._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_pipeline).super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->m_pipeline).super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->m_pipeline).super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((element_type *)local_308._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.pNext !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.pNext);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  return;
}

Assistant:

void ImGuiRenderer::create_pipeline(const Ptr<RenderPass> &render_pass, uint32_t subpass) {
	const Ptr<Device> &device = render_pass->GetDevicePtr();
	{
		VkPushConstantRange push_constant = {};
		push_constant.stageFlags = VK_SHADER_STAGE_VERTEX_BIT;
		push_constant.offset = sizeof(float) * 0;
		push_constant.size = sizeof(float) * 4;

		m_pipeline_layout = PipelineLayout::Create(device, {m_descriptor_set_layout}, {push_constant});
	}
	{
		Ptr<ShaderModule> vert_shader_module, frag_shader_module;
		vert_shader_module = ShaderModule::Create(device, kShaderVertSpv, sizeof(kShaderVertSpv));
		frag_shader_module = ShaderModule::Create(device, kShaderFragSpv, sizeof(kShaderFragSpv));

		VkPipelineShaderStageCreateInfo shader_stages[] = {
		    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
		    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

		VkVertexInputBindingDescription binding_desc[1] = {};
		binding_desc[0].stride = sizeof(ImDrawVert);
		binding_desc[0].inputRate = VK_VERTEX_INPUT_RATE_VERTEX;

		VkVertexInputAttributeDescription attribute_desc[3] = {};
		attribute_desc[0].location = 0;
		attribute_desc[0].binding = binding_desc[0].binding;
		attribute_desc[0].format = VK_FORMAT_R32G32_SFLOAT;
		attribute_desc[0].offset = IM_OFFSETOF(ImDrawVert, pos);
		attribute_desc[1].location = 1;
		attribute_desc[1].binding = binding_desc[0].binding;
		attribute_desc[1].format = VK_FORMAT_R32G32_SFLOAT;
		attribute_desc[1].offset = IM_OFFSETOF(ImDrawVert, uv);
		attribute_desc[2].location = 2;
		attribute_desc[2].binding = binding_desc[0].binding;
		attribute_desc[2].format = VK_FORMAT_R8G8B8A8_UNORM;
		attribute_desc[2].offset = IM_OFFSETOF(ImDrawVert, col);

		VkPipelineVertexInputStateCreateInfo vertex_input_info = {};
		vertex_input_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
		vertex_input_info.vertexBindingDescriptionCount = 1;
		vertex_input_info.pVertexBindingDescriptions = binding_desc;
		vertex_input_info.vertexAttributeDescriptionCount = 3;
		vertex_input_info.pVertexAttributeDescriptions = attribute_desc;

		VkPipelineInputAssemblyStateCreateInfo input_assembly = {};
		input_assembly.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
		input_assembly.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
		input_assembly.primitiveRestartEnable = VK_FALSE;

		VkDynamicState dynamic_states[2] = {VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR};
		VkPipelineDynamicStateCreateInfo dynamic_state = {};
		dynamic_state.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
		dynamic_state.dynamicStateCount = (uint32_t)IM_ARRAYSIZE(dynamic_states);
		dynamic_state.pDynamicStates = dynamic_states;

		VkPipelineViewportStateCreateInfo viewport_state = {};
		viewport_state.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
		viewport_state.viewportCount = 1;
		viewport_state.scissorCount = 1;

		VkPipelineRasterizationStateCreateInfo rasterizer = {};
		rasterizer.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
		rasterizer.depthClampEnable = VK_FALSE;
		rasterizer.rasterizerDiscardEnable = VK_FALSE;
		rasterizer.polygonMode = VK_POLYGON_MODE_FILL;
		rasterizer.lineWidth = 1.0f;
		rasterizer.cullMode = VK_CULL_MODE_NONE;
		rasterizer.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
		rasterizer.depthBiasEnable = VK_FALSE;

		VkPipelineMultisampleStateCreateInfo multisampling = {};
		multisampling.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
		multisampling.sampleShadingEnable = VK_FALSE;
		multisampling.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
		multisampling.minSampleShading = 1.0f;
		multisampling.pSampleMask = nullptr;
		multisampling.alphaToCoverageEnable = VK_FALSE;
		multisampling.alphaToOneEnable = VK_FALSE;

		VkPipelineColorBlendAttachmentState color_blend_attachment = {};
		color_blend_attachment.blendEnable = VK_TRUE;
		color_blend_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_SRC_ALPHA;
		color_blend_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA;
		color_blend_attachment.colorBlendOp = VK_BLEND_OP_ADD;
		color_blend_attachment.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
		color_blend_attachment.dstAlphaBlendFactor = VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA;
		color_blend_attachment.alphaBlendOp = VK_BLEND_OP_ADD;
		color_blend_attachment.colorWriteMask =
		    VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;

		VkPipelineColorBlendStateCreateInfo color_blending = {};
		color_blending.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
		color_blending.attachmentCount = 1;
		color_blending.pAttachments = &color_blend_attachment;

		VkGraphicsPipelineCreateInfo pipeline_info = {};
		pipeline_info.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
		pipeline_info.stageCount = 2;
		pipeline_info.pStages = shader_stages;
		pipeline_info.pVertexInputState = &vertex_input_info;
		pipeline_info.pInputAssemblyState = &input_assembly;
		pipeline_info.pViewportState = &viewport_state;
		pipeline_info.pRasterizationState = &rasterizer;
		pipeline_info.pMultisampleState = &multisampling;
		pipeline_info.pDepthStencilState = nullptr;
		pipeline_info.pColorBlendState = &color_blending;
		pipeline_info.pDynamicState = &dynamic_state;
		pipeline_info.subpass = subpass;

		m_pipeline = GraphicsPipeline::Create(m_pipeline_layout, render_pass, pipeline_info);
	}
}